

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O3

int KVStore::getLevel(string *path)

{
  int iVar1;
  long *__nptr;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  long *local_50;
  long *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::string::find((char *)path,0x10f02a,0);
  std::__cxx11::string::substr((ulong)local_48,(ulong)path);
  __nptr = local_48[0];
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol((char *)__nptr,(char **)&local_50,10);
  if (local_50 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    return (int)lVar3;
  }
  uVar4 = std::__throw_out_of_range("stoi");
  if (*piVar2 == 0) {
    *piVar2 = iVar1;
  }
  getLevel();
  _Unwind_Resume(uVar4);
}

Assistant:

int KVStore::getLevel(const string &path) {
  auto s = path.substr(path.find("level-") + 6);
  return stoi(s);
}